

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O1

void __thiscall TPZAutoPointer<TPZFunction<float>_>::TPZReference::TPZReference(TPZReference *this)

{
  this->fPointer = (TPZFunction<float> *)0x0;
  (this->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (this->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

TPZReference()
        {
            fPointer = nullptr;
            fCounter.store(1);
        }